

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s3acc_io.c
# Opt level: O2

int rdacc_mmie_den(char *dir,char *lat_name,vector_t ****inout_wt_mean,vector_t ****inout_wt_var,
                  float32 ****inout_dnom,uint32 *inout_n_mgau,uint32 *inout_n_stream,
                  uint32 *inout_n_density,uint32 **inout_veclen)

{
  uint32 uVar1;
  vector_t ***ppppfVar2;
  int iVar3;
  ulong uVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  uint32 *out_n_feat;
  uint32 n_stream;
  uint32 n_density;
  uint32 n_mgau;
  uint32 *in_veclen;
  vector_t ***in_wt_var;
  vector_t ***in_wt_mean;
  float32 ***in_dnom;
  float32 ***local_1058;
  vector_t ***local_1050;
  vector_t ***local_1048;
  int32 pass2var;
  char fn [4097];
  
  sprintf(fn,"%s/%s_gauden_counts",dir,lat_name);
  out_n_feat = &n_stream;
  iVar3 = s3gaucnt_read(fn,&in_wt_mean,&in_wt_var,&pass2var,&in_dnom,&n_mgau,out_n_feat,&n_density,
                        &in_veclen);
  if (iVar3 == 0) {
    local_1050 = *inout_wt_mean;
    ppppfVar2 = *inout_wt_var;
    if (local_1050 == (vector_t ***)0x0) {
      *inout_wt_mean = in_wt_mean;
      *inout_dnom = in_dnom;
      *inout_n_mgau = n_mgau;
      *inout_n_stream = n_stream;
      *inout_n_density = n_density;
      *inout_veclen = in_veclen;
      if (in_wt_var == (vector_t ***)0x0 || ppppfVar2 != (vector_t ***)0x0) {
        return 0;
      }
      *inout_wt_var = in_wt_var;
      return 0;
    }
    local_1058 = *inout_dnom;
    uVar1 = *inout_n_mgau;
    bVar5 = uVar1 != n_mgau;
    if (bVar5) {
      out_n_feat = (uint32 *)CONCAT44((int)((ulong)out_n_feat >> 0x20),uVar1);
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3acc_io.c"
              ,0x1eb,"# mix. Gau. for file %s (== %u) != prior # mix. Gau. (== %u)\n",fn,
              (ulong)n_mgau,out_n_feat);
    }
    uVar1 = *inout_n_stream;
    bVar6 = uVar1 != n_stream;
    if (bVar6) {
      out_n_feat = (uint32 *)CONCAT44((int)((ulong)out_n_feat >> 0x20),uVar1);
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3acc_io.c"
              ,0x1f2,"# stream for file %s (== %u) != prior # stream (== %u)\n",fn,(ulong)n_stream,
              out_n_feat);
    }
    uVar1 = *inout_n_density;
    bVar7 = uVar1 != n_density;
    local_1048 = ppppfVar2;
    if (bVar7) {
      out_n_feat = (uint32 *)CONCAT44((int)((ulong)out_n_feat >> 0x20),uVar1);
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3acc_io.c"
              ,0x1f9,"# density comp/mix for file %s (== %u) != prior # density, %u\n",fn,
              (ulong)n_density,out_n_feat);
    }
    bVar7 = bVar7 || (bVar6 || bVar5);
    for (uVar4 = 0; uVar4 < n_stream; uVar4 = uVar4 + 1) {
      if ((*inout_veclen)[uVar4] != in_veclen[uVar4]) {
        out_n_feat = (uint32 *)CONCAT44((int)((ulong)out_n_feat >> 0x20),(*inout_veclen)[uVar4]);
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3acc_io.c"
                ,0x201,"vector length of stream %u (== %u) != prior length (== %u)\n",
                uVar4 & 0xffffffff,(ulong)in_veclen[uVar4],out_n_feat);
        bVar7 = true;
      }
    }
    ckd_free(in_veclen);
    if (!bVar7) {
      accum_3d(local_1058,in_dnom,n_mgau,n_stream,n_density);
      gauden_accum_param(local_1050,in_wt_mean,n_mgau,n_stream,n_density,*inout_veclen);
      gauden_free_param(in_wt_mean);
      if (local_1048 == (vector_t ***)0x0) {
        return 0;
      }
      if (in_wt_var != (vector_t ***)0x0) {
        gauden_accum_param(local_1048,in_wt_var,n_mgau,n_stream,n_density,*inout_veclen);
        gauden_free_param(in_wt_var);
        return 0;
      }
      __assert_fail("in_wt_var",
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3acc_io.c"
                    ,0x213,
                    "int rdacc_mmie_den(const char *, const char *, vector_t ****, vector_t ****, float32 ****, uint32 *, uint32 *, uint32 *, uint32 **)"
                   );
    }
  }
  else {
    fflush(_stdout);
    perror(fn);
  }
  return -1;
}

Assistant:

int
rdacc_mmie_den(const char *dir,
               const char *lat_name,
               vector_t **** inout_wt_mean,
               vector_t **** inout_wt_var,
               float32 **** inout_dnom,
               uint32 * inout_n_mgau,
               uint32 * inout_n_stream,
               uint32 * inout_n_density, uint32 ** inout_veclen)
{
    char fn[MAXPATHLEN + 1];
    vector_t ***in_wt_mean;
    vector_t ***wt_mean;
    vector_t ***in_wt_var;
    vector_t ***wt_var;
    float32 ***in_dnom;
    float32 ***dnom;
    uint32 n_mgau;
    uint32 n_density;
    uint32 n_stream;
    uint32 *in_veclen;
    int32 pass2var;
    int i;

    sprintf(fn, "%s/%s_gauden_counts", dir, lat_name);

    if (s3gaucnt_read(fn,
                      &in_wt_mean,
                      &in_wt_var,
                      &pass2var,
                      &in_dnom,
                      &n_mgau,
                      &n_stream, &n_density, &in_veclen) != S3_SUCCESS) {
        fflush(stdout);
        perror(fn);

        return S3_ERROR;
    }

    wt_mean = *inout_wt_mean;
    wt_var = *inout_wt_var;
    dnom = *inout_dnom;

    if (wt_mean == NULL) {

        /* if a gauden_counts file exists, it will have reestimated means */

        *inout_wt_mean = wt_mean = in_wt_mean;
        *inout_dnom = dnom = in_dnom;
        *inout_n_mgau = n_mgau;
        *inout_n_stream = n_stream;
        *inout_n_density = n_density;
        *inout_veclen = in_veclen;

        if (wt_var == NULL && in_wt_var != NULL) {
            *inout_wt_var = wt_var = in_wt_var;
        }
    }
    else {
        int err = FALSE;

        /* check if matrices are able to be added */
        if (*inout_n_mgau != n_mgau) {
            E_ERROR
                ("# mix. Gau. for file %s (== %u) != prior # mix. Gau. (== %u)\n",
                 fn, n_mgau, *inout_n_mgau);
            err = TRUE;
        }

        if (*inout_n_stream != n_stream) {
            E_ERROR
                ("# stream for file %s (== %u) != prior # stream (== %u)\n",
                 fn, n_stream, *inout_n_stream);
            err = TRUE;
        }

        if (*inout_n_density != n_density) {
            E_ERROR
                ("# density comp/mix for file %s (== %u) != prior # density, %u\n",
                 fn, n_density, *inout_n_density);
            err = TRUE;
        }

        for (i = 0; i < n_stream; i++) {
            if ((*inout_veclen)[i] != in_veclen[i]) {
                E_ERROR
                    ("vector length of stream %u (== %u) != prior length (== %u)\n",
                     i, in_veclen[i], (*inout_veclen)[i]);
                err = TRUE;
            }
        }

        ckd_free((void *) in_veclen);

        if (err)
            return S3_ERROR;

        /* accumulate values */
        accum_3d(dnom, in_dnom, n_mgau, n_stream, n_density);

        gauden_accum_param(wt_mean, in_wt_mean,
                           n_mgau, n_stream, n_density, *inout_veclen);
        gauden_free_param(in_wt_mean);

        if (wt_var) {
            assert(in_wt_var);

            gauden_accum_param(wt_var, in_wt_var,
                               n_mgau, n_stream, n_density, *inout_veclen);
            gauden_free_param(in_wt_var);
        }
    }

    return S3_SUCCESS;
}